

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O2

int convert85(uchar *bytes4,uchar *chars5)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  
  bVar4 = bytes4[1];
  if (bVar4 == 0 && *bytes4 == 0) {
    if ((bytes4[2] == '\0') && (bytes4[3] == '\0')) {
      *chars5 = 'z';
      return 1;
    }
    bVar4 = 0;
  }
  uVar2 = (ulong)((uint)bytes4[3] |
                 (uint)bytes4[2] << 8 | (uint)bVar4 << 0x10 | (uint)*bytes4 << 0x18);
  uVar3 = uVar2 % 0x31c84b1;
  *chars5 = (char)(uVar2 / 0x31c84b1) + '!';
  uVar2 = uVar3 % 0x95eed;
  chars5[1] = (char)(uVar3 / 0x95eed) + '!';
  chars5[2] = (char)(uVar2 / 0x1c39) + '!';
  uVar1 = (uint)(ushort)(uVar2 % 0x1c39);
  chars5[3] = (char)(uVar1 / 0x55) + '!';
  chars5[4] = (char)(uVar1 % 0x55) + '!';
  return 5;
}

Assistant:

static int convert85(const uchar *bytes4, uchar *chars5)
{
  if (bytes4[0] == 0 && bytes4[1] == 0 && bytes4[2] == 0 && bytes4[3] == 0) {
    chars5[0] = 'z';
    return 1;
  }
  unsigned val = bytes4[0]*(256*256*256) + bytes4[1]*(256*256) + bytes4[2]*256 + bytes4[3];
  chars5[0] = val / 52200625 + 33; // 52200625 = 85 to the 4th
  val = val % 52200625;
  chars5[1] = val / 614125 + 33;   // 614125 = 85 cube
  val = val % 614125;
  chars5[2] = val / 7225 + 33;     // 7225 = 85 squared
  val = val % 7225;
  chars5[3] = val / 85 + 33;
  chars5[4] = val % 85 + 33;
  return 5;
}